

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_debug.c
# Opt level: O2

int cmd_debug_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  int iVar1;
  int iVar2;
  char ***argv_p;
  int argc;
  int opt_index;
  option options [2];
  
  argc = 0;
  options[1].flag = (int *)0x0;
  options[1].val = 0;
  options[1]._28_4_ = 0;
  options[1].name = (char *)0x0;
  options[1].has_arg = 0;
  options[1]._12_4_ = 0;
  options[0].flag = (int *)0x0;
  options[0].val = 0x68;
  options[0]._28_4_ = 0;
  options[0].name = "help";
  options[0].has_arg = 0;
  options[0]._12_4_ = 0;
  argv_p = &yo->argv;
  iVar1 = parse_cmdline(cmdline,&argc,argv_p);
  if (iVar1 == 0) {
    iVar2 = getopt_long(argc,*argv_p,commands[0xb].optstring,options,&opt_index);
    iVar1 = _optind;
    if (iVar2 == -1) {
      *posv = *argv_p + _optind;
      *posc = argc - iVar1;
      iVar1 = 0;
    }
    else if (iVar2 == 0x68) {
      cmd_debug_help();
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      yl_log('\x01',"Unknown option.");
    }
  }
  return iVar1;
}

Assistant:

int
cmd_debug_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"help", no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_DEBUG].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'h':
            cmd_debug_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return 0;
}